

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O1

int32_t createLikelySubtagsString
                  (char *lang,int32_t langLength,char *script,int32_t scriptLength,char *region,
                  int32_t regionLength,char *variants,int32_t variantsLength,char *tag,
                  int32_t tagCapacity,UErrorCode *err)

{
  int32_t iVar1;
  char *pcVar2;
  UErrorCode *pUVar3;
  int32_t unaff_R14D;
  int iVar4;
  char tagBuffer [157];
  char likelySubtagsBuffer [157];
  
  if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar1 = (int32_t)err;
    if (0 < regionLength && 0 < scriptLength) {
      pUVar3 = (UErrorCode *)(ulong)(uint)scriptLength;
      createTagStringWithAlternates
                (lang,langLength,script,scriptLength,region,regionLength,(char *)0x0,0,(char *)0x0,
                 tagBuffer,0x9d,err);
      iVar4 = 2;
      if ((*err < U_ILLEGAL_ARGUMENT_ERROR) &&
         (pcVar2 = findLikelySubtags(tagBuffer,likelySubtagsBuffer,iVar1,pUVar3),
         *err < U_ILLEGAL_ARGUMENT_ERROR)) {
        if (pcVar2 == (char *)0x0) {
          iVar4 = 0;
        }
        else {
          unaff_R14D = createTagStringWithAlternates
                                 ((char *)0x0,0,(char *)0x0,0,(char *)0x0,0,variants,variantsLength,
                                  pcVar2,tag,tagCapacity,err);
          iVar4 = 1;
        }
      }
      if (iVar4 == 2) goto LAB_002a07ac;
      if (iVar4 != 0) {
        return unaff_R14D;
      }
    }
    if (0 < scriptLength) {
      pUVar3 = (UErrorCode *)(ulong)(uint)scriptLength;
      createTagStringWithAlternates
                (lang,langLength,script,scriptLength,(char *)0x0,0,(char *)0x0,0,(char *)0x0,
                 tagBuffer,0x9d,err);
      iVar4 = 2;
      if ((*err < U_ILLEGAL_ARGUMENT_ERROR) &&
         (pcVar2 = findLikelySubtags(tagBuffer,likelySubtagsBuffer,iVar1,pUVar3),
         *err < U_ILLEGAL_ARGUMENT_ERROR)) {
        if (pcVar2 == (char *)0x0) {
          iVar4 = 0;
        }
        else {
          unaff_R14D = createTagStringWithAlternates
                                 ((char *)0x0,0,(char *)0x0,0,region,regionLength,variants,
                                  variantsLength,pcVar2,tag,tagCapacity,err);
          iVar4 = 1;
        }
      }
      if (iVar4 == 2) goto LAB_002a07ac;
      if (iVar4 != 0) {
        return unaff_R14D;
      }
    }
    if (0 < regionLength) {
      pUVar3 = (UErrorCode *)0x0;
      createTagStringWithAlternates
                (lang,langLength,(char *)0x0,0,region,regionLength,(char *)0x0,0,(char *)0x0,
                 tagBuffer,0x9d,err);
      iVar4 = 2;
      if ((*err < U_ILLEGAL_ARGUMENT_ERROR) &&
         (pcVar2 = findLikelySubtags(tagBuffer,likelySubtagsBuffer,iVar1,pUVar3),
         *err < U_ILLEGAL_ARGUMENT_ERROR)) {
        if (pcVar2 == (char *)0x0) {
          iVar4 = 0;
        }
        else {
          unaff_R14D = createTagStringWithAlternates
                                 ((char *)0x0,0,script,scriptLength,(char *)0x0,0,variants,
                                  variantsLength,pcVar2,tag,tagCapacity,err);
          iVar4 = 1;
        }
      }
      if (iVar4 == 2) goto LAB_002a07ac;
      if (iVar4 != 0) {
        return unaff_R14D;
      }
    }
    pUVar3 = (UErrorCode *)0x0;
    createTagStringWithAlternates
              (lang,langLength,(char *)0x0,0,(char *)0x0,0,(char *)0x0,0,(char *)0x0,tagBuffer,0x9d,
               err);
    iVar4 = 2;
    if ((*err < U_ILLEGAL_ARGUMENT_ERROR) &&
       (pcVar2 = findLikelySubtags(tagBuffer,likelySubtagsBuffer,iVar1,pUVar3),
       *err < U_ILLEGAL_ARGUMENT_ERROR)) {
      if (pcVar2 == (char *)0x0) {
        iVar4 = 0;
      }
      else {
        unaff_R14D = createTagStringWithAlternates
                               ((char *)0x0,0,script,scriptLength,region,regionLength,variants,
                                variantsLength,pcVar2,tag,tagCapacity,err);
        iVar4 = 1;
      }
    }
    if (iVar4 != 2) {
      if (iVar4 != 0) {
        return unaff_R14D;
      }
      iVar1 = u_terminateChars_63(tag,tagCapacity,0,err);
      return iVar1;
    }
  }
LAB_002a07ac:
  if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
    *err = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return -1;
}

Assistant:

static int32_t U_CALLCONV
createLikelySubtagsString(
    const char* lang,
    int32_t langLength,
    const char* script,
    int32_t scriptLength,
    const char* region,
    int32_t regionLength,
    const char* variants,
    int32_t variantsLength,
    char* tag,
    int32_t tagCapacity,
    UErrorCode* err)
{
    /**
     * ULOC_FULLNAME_CAPACITY will provide enough capacity
     * that we can build a string that contains the language,
     * script and region code without worrying about overrunning
     * the user-supplied buffer.
     **/
    char tagBuffer[ULOC_FULLNAME_CAPACITY];
    char likelySubtagsBuffer[ULOC_FULLNAME_CAPACITY];

    if(U_FAILURE(*err)) {
        goto error;
    }

    /**
     * Try the language with the script and region first.
     **/
    if (scriptLength > 0 && regionLength > 0) {

        const char* likelySubtags = NULL;

        createTagString(
            lang,
            langLength,
            script,
            scriptLength,
            region,
            regionLength,
            NULL,
            0,
            tagBuffer,
            sizeof(tagBuffer),
            err);
        if(U_FAILURE(*err)) {
            goto error;
        }

        likelySubtags =
            findLikelySubtags(
                tagBuffer,
                likelySubtagsBuffer,
                sizeof(likelySubtagsBuffer),
                err);
        if(U_FAILURE(*err)) {
            goto error;
        }

        if (likelySubtags != NULL) {
            /* Always use the language tag from the
               maximal string, since it may be more
               specific than the one provided. */
            return createTagStringWithAlternates(
                        NULL,
                        0,
                        NULL,
                        0,
                        NULL,
                        0,
                        variants,
                        variantsLength,
                        likelySubtags,
                        tag,
                        tagCapacity,
                        err);
        }
    }

    /**
     * Try the language with just the script.
     **/
    if (scriptLength > 0) {

        const char* likelySubtags = NULL;

        createTagString(
            lang,
            langLength,
            script,
            scriptLength,
            NULL,
            0,
            NULL,
            0,
            tagBuffer,
            sizeof(tagBuffer),
            err);
        if(U_FAILURE(*err)) {
            goto error;
        }

        likelySubtags =
            findLikelySubtags(
                tagBuffer,
                likelySubtagsBuffer,
                sizeof(likelySubtagsBuffer),
                err);
        if(U_FAILURE(*err)) {
            goto error;
        }

        if (likelySubtags != NULL) {
            /* Always use the language tag from the
               maximal string, since it may be more
               specific than the one provided. */
            return createTagStringWithAlternates(
                        NULL,
                        0,
                        NULL,
                        0,
                        region,
                        regionLength,
                        variants,
                        variantsLength,
                        likelySubtags,
                        tag,
                        tagCapacity,
                        err);
        }
    }

    /**
     * Try the language with just the region.
     **/
    if (regionLength > 0) {

        const char* likelySubtags = NULL;

        createTagString(
            lang,
            langLength,
            NULL,
            0,
            region,
            regionLength,
            NULL,
            0,
            tagBuffer,
            sizeof(tagBuffer),
            err);
        if(U_FAILURE(*err)) {
            goto error;
        }

        likelySubtags =
            findLikelySubtags(
                tagBuffer,
                likelySubtagsBuffer,
                sizeof(likelySubtagsBuffer),
                err);
        if(U_FAILURE(*err)) {
            goto error;
        }

        if (likelySubtags != NULL) {
            /* Always use the language tag from the
               maximal string, since it may be more
               specific than the one provided. */
            return createTagStringWithAlternates(
                        NULL,
                        0,
                        script,
                        scriptLength,
                        NULL,
                        0,
                        variants,
                        variantsLength,
                        likelySubtags,
                        tag,
                        tagCapacity,
                        err);
        }
    }

    /**
     * Finally, try just the language.
     **/
    {
        const char* likelySubtags = NULL;

        createTagString(
            lang,
            langLength,
            NULL,
            0,
            NULL,
            0,
            NULL,
            0,
            tagBuffer,
            sizeof(tagBuffer),
            err);
        if(U_FAILURE(*err)) {
            goto error;
        }

        likelySubtags =
            findLikelySubtags(
                tagBuffer,
                likelySubtagsBuffer,
                sizeof(likelySubtagsBuffer),
                err);
        if(U_FAILURE(*err)) {
            goto error;
        }

        if (likelySubtags != NULL) {
            /* Always use the language tag from the
               maximal string, since it may be more
               specific than the one provided. */
            return createTagStringWithAlternates(
                        NULL,
                        0,
                        script,
                        scriptLength,
                        region,
                        regionLength,
                        variants,
                        variantsLength,
                        likelySubtags,
                        tag,
                        tagCapacity,
                        err);
        }
    }

    return u_terminateChars(
                tag,
                tagCapacity,
                0,
                err);

error:

    if (!U_FAILURE(*err)) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
    }

    return -1;
}